

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

rtosc_arg_val_t * rtosc_itr_next(rtosc_arg_val_t *__return_storage_ptr__,rtosc_arg_itr_t *itr)

{
  char type;
  uint8_t *arg_mem;
  uint uVar1;
  char *pcVar2;
  rtosc_arg_t rVar3;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->val).d = 0.0;
  (__return_storage_ptr__->val).b.data = (uint8_t *)0x0;
  pcVar2 = itr->type_pos;
  type = *pcVar2;
  __return_storage_ptr__->type = type;
  if (type != '\0') {
    rVar3 = extract_arg(itr->value_pos,type);
    __return_storage_ptr__->val = rVar3;
  }
  pcVar2 = advance_past_dummy_args(pcVar2 + 1);
  itr->type_pos = pcVar2;
  arg_mem = itr->value_pos;
  uVar1 = arg_size(arg_mem,type);
  itr->value_pos = arg_mem + (int)uVar1;
  return __return_storage_ptr__;
}

Assistant:

rtosc_arg_val_t rtosc_itr_next(rtosc_arg_itr_t *itr)
{
    //current position provides the value
    rtosc_arg_val_t result = {0,{0}};
    result.type = *itr->type_pos;
    if(result.type)
        result.val = extract_arg(itr->value_pos, result.type);

    //advance
    itr->type_pos = advance_past_dummy_args(itr->type_pos+1);
    char type = result.type;
    int size  = arg_size(itr->value_pos, type);
    itr->value_pos += size;


    return result;
}